

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

void __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::clear(raw_quasi_adaptive_huffman_data_model *this)

{
  unsigned_short *puVar1;
  uchar *p;
  decoder_tables *p_00;
  uint32 *puVar2;
  uint16 *puVar3;
  
  puVar1 = (this->m_sym_freq).m_p;
  if (puVar1 != (unsigned_short *)0x0) {
    lzham_free(puVar1);
    (this->m_sym_freq).m_p = (unsigned_short *)0x0;
    (this->m_sym_freq).m_size = 0;
    (this->m_sym_freq).m_capacity = 0;
  }
  puVar1 = (this->m_codes).m_p;
  if (puVar1 != (unsigned_short *)0x0) {
    lzham_free(puVar1);
    (this->m_codes).m_p = (unsigned_short *)0x0;
    (this->m_codes).m_size = 0;
    (this->m_codes).m_capacity = 0;
  }
  p = (this->m_code_sizes).m_p;
  if (p != (uchar *)0x0) {
    lzham_free(p);
    (this->m_code_sizes).m_p = (uchar *)0x0;
    (this->m_code_sizes).m_size = 0;
    (this->m_code_sizes).m_capacity = 0;
  }
  this->m_total_syms = 0;
  this->m_max_cycle = 0;
  this->m_update_cycle = 0;
  this->m_symbols_until_update = 0;
  *(undefined8 *)((long)&this->m_symbols_until_update + 1) = 0;
  p_00 = this->m_pDecode_tables;
  if (p_00 != (decoder_tables *)0x0) {
    puVar2 = p_00->m_lookup;
    if ((puVar2 != (uint32 *)0x0) && ((puVar2[-2] ^ puVar2[-1]) == 0xffffffff)) {
      lzham_free(puVar2 + -4);
    }
    puVar3 = p_00->m_sorted_symbol_order;
    if ((puVar3 != (uint16 *)0x0) &&
       ((*(uint *)(puVar3 + -4) ^ *(uint *)(puVar3 + -2)) == 0xffffffff)) {
      lzham_free(puVar3 + -8);
    }
    lzham_free(p_00);
    this->m_pDecode_tables = (decoder_tables *)0x0;
  }
  this->m_fast_updating = false;
  this->m_use_polar_codes = false;
  return;
}

Assistant:

void raw_quasi_adaptive_huffman_data_model::clear()
   {
      m_sym_freq.clear();
      m_codes.clear();
      m_code_sizes.clear();

      m_max_cycle = 0;
      m_total_syms = 0;
      m_update_cycle = 0;
      m_symbols_until_update = 0;
      m_decoder_table_bits = 0;
      m_total_count = 0;

      if (m_pDecode_tables)
      {
         lzham_delete(m_pDecode_tables);
         m_pDecode_tables = NULL;
      }

      m_fast_updating = false;
      m_use_polar_codes = false;
   }